

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O3

_Bool build_large(chunk *c,loc_conflict centre,wchar_t rating)

{
  _Bool _Var1;
  uint32_t uVar2;
  wchar_t y;
  loc_conflict lVar3;
  loc lVar4;
  loc_conflict grid;
  wchar_t wVar5;
  wchar_t wVar6;
  int iVar7;
  wchar_t wVar8;
  wchar_t wVar9;
  int iVar10;
  int y_00;
  uint uVar11;
  uint uVar12;
  bool bVar13;
  wchar_t flag;
  loc_conflict local_50;
  wchar_t local_44;
  loc_conflict local_40;
  wchar_t local_34;
  
  wVar5 = c->depth;
  local_50 = centre;
  uVar2 = Rand_div(0x19);
  event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,L'\v',L'\x19');
  y = centre.y;
  if ((c->height <= y) || (c->width <= centre.x)) {
    _Var1 = find_space(&local_50,L'\v',L'\x19');
    if (!_Var1) {
      return false;
    }
    centre = (loc_conflict)((ulong)local_50 & 0xffffffff);
    y = local_50.y;
  }
  iVar10 = centre.x;
  local_44 = iVar10 + L'\v';
  local_40 = centre;
  generate_room(c,y + L'\xfffffffb',iVar10 + L'\xfffffff4',y + L'\x05',iVar10 + L'\f',
                (uint)(wVar5 <= uVar2 + L'\x01'));
  lVar3 = local_40;
  draw_rectangle(c,y + L'\xfffffffb',iVar10 + L'\xfffffff4',y + L'\x05',iVar10 + L'\f',FEAT_GRANITE,
                 L'\f',false);
  fill_rectangle(c,y + L'\xfffffffc',iVar10 + L'\xfffffff5',y + L'\x04',local_44,FEAT_FLOOR,L'\0');
  wVar8 = y + L'\xfffffffd';
  iVar10 = lVar3.x;
  wVar5 = iVar10 + L'\xfffffff6';
  wVar9 = y + L'\x03';
  wVar6 = iVar10 + L'\n';
  flag = L'\v';
  draw_rectangle(c,wVar8,wVar5,wVar9,wVar6,FEAT_GRANITE,L'\v',false);
  uVar2 = Rand_div(5);
  if (uVar2 < 5) {
    switch(uVar2) {
    case 0:
      event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"plain");
      generate_hole(c,wVar8,wVar5,wVar9,wVar6,FEAT_CLOSED);
      vault_monsters((chunk_conflict *)c,local_50,c->depth + L'\x02',L'\x01');
      return true;
    case 1:
      event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"nested");
      generate_hole(c,wVar8,wVar5,wVar9,wVar6,FEAT_CLOSED);
      wVar5 = y + L'\xffffffff';
      draw_rectangle(c,wVar5,iVar10 + L'\xffffffff',y + L'\x01',iVar10 + L'\x01',FEAT_GRANITE,L'\v',
                     false);
      generate_hole(c,wVar5,iVar10 + L'\xffffffff',y + L'\x01',iVar10 + L'\x01',FEAT_CLOSED);
      iVar7 = iVar10 + -2;
      do {
        iVar7 = iVar7 + 1;
        lVar4 = (loc)loc(iVar7,wVar5);
        _Var1 = square_iscloseddoor((chunk_conflict *)c,lVar4);
        if (_Var1) {
          uVar2 = Rand_div(7);
          square_set_door_lock(c,lVar4,uVar2 + L'\x01');
        }
      } while ((iVar7 <= iVar10) ||
              (bVar13 = wVar5 <= y, iVar7 = iVar10 + -2, wVar5 = wVar5 + L'\x01', bVar13));
      wVar5 = c->depth;
      uVar2 = Rand_div(3);
      lVar3 = local_50;
      vault_monsters((chunk_conflict *)c,local_50,wVar5 + L'\x02',uVar2 + L'\x03');
      uVar2 = Rand_div(100);
      if (((int)uVar2 < 0x50) || (dun->persist == true)) {
        place_object((chunk_conflict *)c,lVar3,c->depth,false,false,'\x03',L'\0');
      }
      else {
        place_random_stairs((chunk_conflict *)c,lVar3);
      }
      uVar2 = Rand_div(3);
      vault_traps((chunk_conflict *)c,lVar3,L'\x04',L'\n',uVar2 + L'\x03');
      break;
    case 2:
      event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"pillar");
      generate_hole(c,wVar8,wVar5,wVar9,wVar6,FEAT_CLOSED);
      wVar6 = y + L'\xffffffff';
      wVar5 = y + L'\x01';
      fill_rectangle(c,wVar6,iVar10 + L'\xffffffff',wVar5,iVar10 + L'\x01',FEAT_GRANITE,L'\v');
      uVar2 = Rand_div(2);
      if (uVar2 == 0) {
        uVar2 = Rand_div(2);
        bVar13 = uVar2 == 0;
        fill_rectangle(c,wVar6,(iVar10 - (uint)bVar13) + L'\xfffffffa',wVar5,
                       (iVar10 - (uint)bVar13) + L'\xfffffffc',FEAT_GRANITE,L'\v');
        fill_rectangle(c,wVar6,(uint)bVar13 + iVar10 + L'\x04',wVar5,iVar10 + 6 + (uint)bVar13,
                       FEAT_GRANITE,L'\v');
      }
      uVar2 = Rand_div(3);
      if (uVar2 != 0) {
        return true;
      }
      draw_rectangle(c,wVar6,iVar10 + L'\xfffffffb',wVar5,iVar10 + L'\x05',FEAT_GRANITE,L'\v',false)
      ;
      uVar2 = Rand_div(2);
      lVar3 = loc(iVar10 + -3,wVar6 + uVar2 * 2);
      place_secret_door((chunk_conflict *)c,lVar3);
      uVar2 = Rand_div(2);
      lVar3 = loc(iVar10 + 3,wVar6 + uVar2 * 2);
      place_secret_door((chunk_conflict *)c,lVar3);
      lVar3 = loc(iVar10 + -2,y);
      wVar5 = c->depth;
      uVar2 = Rand_div(2);
      vault_monsters((chunk_conflict *)c,lVar3,wVar5 + L'\x02',uVar2 + L'\x01');
      lVar3 = loc(iVar10 + 2,y);
      wVar5 = c->depth;
      uVar2 = Rand_div(2);
      vault_monsters((chunk_conflict *)c,lVar3,wVar5 + L'\x02',uVar2 + L'\x01');
      uVar2 = Rand_div(3);
      if (uVar2 == 0) {
        lVar3 = loc(iVar10 + -2,y);
        place_object((chunk_conflict *)c,lVar3,c->depth,false,false,'\x03',L'\0');
      }
      uVar2 = Rand_div(3);
      if (uVar2 != 0) {
        return true;
      }
      lVar3 = loc(iVar10 + 2,y);
      place_object((chunk_conflict *)c,lVar3,c->depth,false,false,'\x03',L'\0');
      return true;
    case 3:
      local_34 = iVar10 + L'\xfffffff7';
      event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"checkerboard");
      generate_hole(c,wVar8,wVar5,wVar9,wVar6,FEAT_CLOSED);
      uVar11 = (y + iVar10) - 0xb;
      wVar6 = wVar5;
      wVar8 = local_34;
      local_44 = y + L'\x02';
      uVar12 = uVar11;
      wVar9 = y + L'\xfffffffe';
      do {
        do {
          if ((uVar11 & 1) != 0) {
            lVar4 = (loc)loc(wVar8,wVar9);
            square_set_feat((chunk_conflict *)c,lVar4,FEAT_GRANITE);
            lVar3 = local_40;
            generate_mark(c,lVar4.y,lVar4.x,lVar4.y,lVar4.x,L'\v');
          }
          wVar6 = wVar6 + L'\x01';
          uVar11 = uVar11 + 1;
          wVar8 = wVar8 + L'\x01';
        } while (wVar6 < iVar10 + L'\t');
        uVar11 = uVar12 + 1;
        bVar13 = wVar9 < local_44;
        wVar6 = wVar5;
        wVar8 = local_34;
        uVar12 = uVar11;
        wVar9 = wVar9 + L'\x01';
      } while (bVar13);
      iVar10 = lVar3.x;
      lVar3 = loc(iVar10 + -5,y);
      wVar5 = c->depth;
      uVar2 = Rand_div(3);
      vault_monsters((chunk_conflict *)c,lVar3,wVar5 + L'\x02',uVar2 + L'\x01');
      lVar3 = loc(iVar10 + 5,y);
      wVar5 = c->depth;
      uVar2 = Rand_div(3);
      vault_monsters((chunk_conflict *)c,lVar3,wVar5 + L'\x02',uVar2 + L'\x01');
      lVar3 = loc(iVar10 + -3,y);
      uVar2 = Rand_div(3);
      vault_traps((chunk_conflict *)c,lVar3,L'\x02',L'\b',uVar2 + L'\x01');
      lVar3 = loc(iVar10 + 3,y);
      uVar2 = Rand_div(3);
      vault_traps((chunk_conflict *)c,lVar3,L'\x02',L'\b',uVar2 + L'\x01');
      vault_objects((chunk_conflict *)c,local_50,c->depth,L'\x03');
      break;
    case 4:
      event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"compartments");
      generate_plus(c,y + L'\xfffffffe',iVar10 + L'\xfffffff7',y + L'\x02',iVar10 + L'\t',
                    FEAT_GRANITE,flag);
      uVar2 = Rand_div(100);
      if ((int)uVar2 < 0x32) {
        uVar2 = Rand_div(10);
        iVar10 = local_40.x;
        iVar7 = iVar10 - (uVar2 + 1);
        lVar3 = loc(iVar7,wVar8);
        place_closed_door((chunk_conflict *)c,lVar3);
        iVar10 = uVar2 + iVar10 + 1;
        lVar3 = loc(iVar10,wVar8);
        place_closed_door((chunk_conflict *)c,lVar3);
        lVar3 = loc(iVar7,wVar9);
        place_closed_door((chunk_conflict *)c,lVar3);
        lVar3 = loc(iVar10,wVar9);
      }
      else {
        uVar2 = Rand_div(3);
        local_40.x = wVar6;
        iVar7 = uVar2 + y + 1;
        lVar3 = loc(wVar5,iVar7);
        place_closed_door((chunk_conflict *)c,lVar3);
        y_00 = y - (uVar2 + 1);
        lVar3 = loc(wVar5,y_00);
        place_closed_door((chunk_conflict *)c,lVar3);
        iVar10 = local_40.x;
        lVar3 = loc(local_40.x,iVar7);
        place_closed_door((chunk_conflict *)c,lVar3);
        lVar3 = loc(iVar10,y_00);
      }
      place_closed_door((chunk_conflict *)c,lVar3);
      wVar5 = c->depth;
      uVar2 = Rand_div(2);
      lVar3 = local_50;
      vault_objects((chunk_conflict *)c,local_50,wVar5,uVar2 + L'\x03');
      iVar10 = lVar3.x + -4;
      grid = loc(iVar10,y + L'\x01');
      wVar5 = c->depth;
      uVar2 = Rand_div(4);
      vault_monsters((chunk_conflict *)c,grid,wVar5 + L'\x02',uVar2 + L'\x01');
      iVar7 = lVar3.x + 4;
      lVar3 = loc(iVar7,y + L'\x01');
      wVar5 = c->depth;
      uVar2 = Rand_div(4);
      vault_monsters((chunk_conflict *)c,lVar3,wVar5 + L'\x02',uVar2 + L'\x01');
      lVar3 = loc(iVar10,y + L'\xffffffff');
      wVar5 = c->depth;
      uVar2 = Rand_div(4);
      vault_monsters((chunk_conflict *)c,lVar3,wVar5 + L'\x02',uVar2 + L'\x01');
      lVar3 = loc(iVar7,y + L'\xffffffff');
      wVar5 = c->depth;
      uVar2 = Rand_div(4);
      vault_monsters((chunk_conflict *)c,lVar3,wVar5 + L'\x02',uVar2 + L'\x01');
    }
    return true;
  }
  return true;
}

Assistant:

bool build_large(struct chunk *c, struct loc centre, int rating)
{
	int y, x, y1, x1, y2, x2;
	int height = 9;
	int width = 23;

	int light = false;

	/* Occasional light */
	if (c->depth <= randint1(25)) light = true;

	/* Find and reserve some space in the dungeon.  Get center of room. */
	event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE, height + 2, width + 2);
	if ((centre.y >= c->height) || (centre.x >= c->width)) {
		if (!find_space(&centre, height + 2, width + 2))
			return (false);
	}

	/* Large room */
	y1 = centre.y - height / 2;
	y2 = centre.y + height / 2;
	x1 = centre.x - width / 2;
	x2 = centre.x + width / 2;

	/* Generate new room */
	generate_room(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, light);

	/* Generate outer walls */
	draw_rectangle(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_GRANITE,
		SQUARE_WALL_OUTER, false);

	/* Generate inner floors */
	fill_rectangle(c, y1, x1, y2, x2, FEAT_FLOOR, SQUARE_NONE);

	/* The inner room */
	y1 = y1 + 2;
	y2 = y2 - 2;
	x1 = x1 + 2;
	x2 = x2 - 2;

	/* Generate inner walls */
	draw_rectangle(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_GRANITE,
		SQUARE_WALL_INNER, false);

	/* Inner room variations */
	switch (randint1(5)) {
		/* An inner room */
	case 1: {
		/* Open the inner room with a door and place a monster */
		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, "plain");
		generate_hole(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_CLOSED);
		vault_monsters(c, centre, c->depth + 2, 1);
		break;
	}


		/* An inner room with a small inner room */
	case 2: {
		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, "nested");

		/* Open the inner room with a door */
		generate_hole(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_CLOSED);

		/* Place another inner room */
		draw_rectangle(c, centre.y - 1, centre.x - 1, centre.y + 1,
			centre.x + 1, FEAT_GRANITE, SQUARE_WALL_INNER, false);

		/* Open the inner room with a locked door */
		generate_hole(c, centre.y - 1, centre.x - 1, centre.y + 1, centre.x + 1,
					  FEAT_CLOSED);
		for (y = centre.y - 1; y <= centre.y + 1; y++) {
			for (x = centre.x - 1; x <= centre.x + 1; x++) {
				struct loc grid = loc(x, y);
				if (square_iscloseddoor(c, grid)) {
					square_set_door_lock(c, grid, randint1(7));
				}
			}
		}

		/* Monsters to guard the treasure */
		vault_monsters(c, centre, c->depth + 2, randint1(3) + 2);

		/* Object (80%) or Stairs (20%) */
		if (randint0(100) < 80 || dun->persist) {
			place_object(c, centre, c->depth, false, false, ORIGIN_SPECIAL, 0);
		} else {
			place_random_stairs(c, centre);
		}

		/* Traps to protect the treasure */
		vault_traps(c, centre, 4, 10, 2 + randint1(3));

		break;
	}


		/* An inner room with an inner pillar or pillars */
	case 3: {
		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, "pillar");

		/* Open the inner room with a secret door */
		generate_hole(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_CLOSED);

		/* Inner pillar */
		fill_rectangle(c, centre.y - 1, centre.x - 1, centre.y + 1,
					   centre.x + 1, FEAT_GRANITE, SQUARE_WALL_INNER);

		/* Occasionally, two more Large Inner Pillars */
		if (one_in_(2)) {
			if (one_in_(2)) {
				fill_rectangle(c, centre.y - 1, centre.x - 7, centre.y + 1,
							   centre.x - 5, FEAT_GRANITE, SQUARE_WALL_INNER);
				fill_rectangle(c, centre.y - 1, centre.x + 5, centre.y + 1,
							   centre.x + 7, FEAT_GRANITE, SQUARE_WALL_INNER);
			} else {
				fill_rectangle(c, centre.y - 1, centre.x - 6, centre.y + 1,
							   centre.x - 4, FEAT_GRANITE, SQUARE_WALL_INNER);
				fill_rectangle(c, centre.y - 1, centre.x + 4, centre.y + 1,
							   centre.x + 6, FEAT_GRANITE, SQUARE_WALL_INNER);
			}
		}

		/* Occasionally, some Inner rooms */
		if (one_in_(3)) {
			/* Inner rectangle */
			draw_rectangle(c, centre.y - 1, centre.x - 5, centre.y + 1,
				centre.x + 5, FEAT_GRANITE,
				SQUARE_WALL_INNER, false);

			/* Secret doors (random top/bottom) */
			place_secret_door(c, loc(centre.x - 3,
									 centre.y - 3 + (randint1(2) * 2)));
			place_secret_door(c, loc(centre.x + 3,
									 centre.y - 3 + (randint1(2) * 2)));

			/* Monsters */
			vault_monsters(c, loc(centre.x - 2, centre.y), c->depth + 2,
						   randint1(2));
			vault_monsters(c, loc(centre.x + 2, centre.y), c->depth + 2,
						   randint1(2));

			/* Objects */
			if (one_in_(3))
				place_object(c, loc(centre.x - 2, centre.y), c->depth, false,
							 false, ORIGIN_SPECIAL, 0);
			if (one_in_(3))
				place_object(c, loc(centre.x + 2, centre.y), c->depth, false,
							 false, ORIGIN_SPECIAL, 0);
		}

		break;
	}


		/* An inner room with a checkerboard */
	case 4: {
		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,
			"checkerboard");

		/* Open the inner room with a secret door */
		generate_hole(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_CLOSED);

		/* Checkerboard */
		for (y = y1; y <= y2; y++)
			for (x = x1; x <= x2; x++)
				if ((x + y) & 0x01)
					set_marked_granite(c, loc(x, y), SQUARE_WALL_INNER);

		/* Monsters just love mazes. */
		vault_monsters(c, loc(centre.x - 5, centre.y), c->depth + 2,
					   randint1(3));
		vault_monsters(c, loc(centre.x + 5, centre.y), c->depth + 2,
					   randint1(3));

		/* Traps make them entertaining. */
		vault_traps(c, loc(centre.x - 3, centre.y), 2, 8, randint1(3));
		vault_traps(c, loc(centre.x + 3, centre.y), 2, 8, randint1(3));

		/* Mazes should have some treasure too. */
		vault_objects(c, centre, c->depth, 3);

		break;
	}


		/* Four small rooms. */
	case 5: {
		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,
			"compartments");

		/* Inner "cross" */
		generate_plus(c, y1, x1, y2, x2, FEAT_GRANITE, SQUARE_WALL_INNER);

		/* Doors into the rooms */
		if (randint0(100) < 50) {
			int i = randint1(10);
			place_closed_door(c, loc(centre.x - i, y1 - 1));
			place_closed_door(c, loc(centre.x + i, y1 - 1));
			place_closed_door(c, loc(centre.x - i, y2 + 1));
			place_closed_door(c, loc(centre.x + i, y2 + 1));
		} else {
			int i = randint1(3);
			place_closed_door(c, loc(x1 - 1, centre.y + i));
			place_closed_door(c, loc(x1 - 1, centre.y - i));
			place_closed_door(c, loc(x2 + 1, centre.y + i));
			place_closed_door(c, loc(x2 + 1, centre.y - i));
		}

		/* Treasure, centered at the center of the cross */
		vault_objects(c, centre, c->depth, 2 + randint1(2));

		/* Gotta have some monsters */
		vault_monsters(c, loc(centre.x - 4, centre.y + 1), c->depth + 2,
					   randint1(4));
		vault_monsters(c, loc(centre.x + 4, centre.y + 1), c->depth + 2,
					   randint1(4));
		vault_monsters(c, loc(centre.x - 4, centre.y - 1), c->depth + 2,
					   randint1(4));
		vault_monsters(c, loc(centre.x + 4, centre.y - 1), c->depth + 2,
					   randint1(4)); 

		break;
	}
	}

	return true;
}